

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::GlobalConstPoolPass::run(GlobalConstPoolPass *this,Zone *zone,Logger *logger)

{
  long lVar1;
  BaseNode *in_RDX;
  BaseNode *in_RSI;
  BaseBuilder *in_RDI;
  ConstPoolNode *globalConstPool;
  BaseCompiler *compiler;
  
  lVar1 = *(long *)&(in_RDI->super_BaseEmitter)._emitterType;
  if (*(long *)(lVar1 + 0x210) != 0) {
    BaseBuilder::addAfter(in_RDI,in_RSI,in_RDX);
    *(undefined8 *)(lVar1 + 0x210) = 0;
  }
  return 0;
}

Assistant:

Error run(Zone* zone, Logger* logger) override {
    DebugUtils::unused(zone, logger);

    // Flush the global constant pool.
    BaseCompiler* compiler = static_cast<BaseCompiler*>(_cb);
    ConstPoolNode* globalConstPool = compiler->_constPools[uint32_t(ConstPoolScope::kGlobal)];

    if (globalConstPool) {
      compiler->addAfter(globalConstPool, compiler->lastNode());
      compiler->_constPools[uint32_t(ConstPoolScope::kGlobal)] = nullptr;
    }

    return kErrorOk;
  }